

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O2

void JSONWorker::DoArray(internalJSONNode *parent,json_string *value_t)

{
  size_type sVar1;
  pointer pcVar2;
  size_t sVar3;
  size_t sVar4;
  json_string *pjVar5;
  allocator local_71;
  json_string newValue;
  json_string local_50;
  
  sVar1 = value_t->_M_string_length;
  std::__cxx11::string::string((string *)&newValue,"DoArray is empty",(allocator *)&local_50);
  JSONDebug::_JSON_ASSERT(sVar1 != 0,&newValue);
  std::__cxx11::string::~string((string *)&newValue);
  if (*(value_t->_M_dataplus)._M_p == '[') {
    if (2 < value_t->_M_string_length) {
      newValue._M_dataplus._M_p = (pointer)&newValue.field_2;
      newValue._M_string_length = 0;
      newValue.field_2._M_local_buf[0] = '\0';
      sVar4 = 1;
      while( true ) {
        sVar3 = FindNextRelevant<(char)44>(value_t,sVar4);
        pcVar2 = (value_t->_M_dataplus)._M_p;
        if (sVar3 == 0xffffffffffffffff) break;
        std::__cxx11::string::
        assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)&newValue,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(pcVar2 + sVar4),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(pcVar2 + sVar3));
        sVar4 = FindNextRelevant<(char)58>(&newValue,0);
        if (sVar4 != 0xffffffffffffffff) {
          std::__cxx11::string::string
                    ((string *)&local_50,"Key/Value pairs are not allowed in arrays",&local_71);
          goto LAB_00114c21;
        }
        pjVar5 = jsonSingletonEMPTY_JSON_STRING::getValue_abi_cxx11_();
        NewNode(parent,pjVar5,&newValue,true);
        sVar4 = sVar3 + 1;
      }
      std::__cxx11::string::
      assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)&newValue,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(pcVar2 + sVar4),
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(pcVar2 + (value_t->_M_string_length - 1)));
      sVar4 = FindNextRelevant<(char)58>(&newValue,0);
      if (sVar4 == 0xffffffffffffffff) {
        pjVar5 = jsonSingletonEMPTY_JSON_STRING::getValue_abi_cxx11_();
        NewNode(parent,pjVar5,&newValue,true);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_50,"Key/Value pairs are not allowed in arrays",&local_71);
LAB_00114c21:
        JSONDebug::_JSON_FAIL(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        internalJSONNode::Nullify(parent);
      }
      std::__cxx11::string::~string((string *)&newValue);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&newValue,"DoArray is not an array",(allocator *)&local_50);
    JSONDebug::_JSON_FAIL(&newValue);
    std::__cxx11::string::~string((string *)&newValue);
    internalJSONNode::Nullify(parent);
  }
  return;
}

Assistant:

void JSONWorker::DoArray(const internalJSONNode * parent, const json_string & value_t) json_nothrow {
	//This takes an array and creates nodes out of them
	JSON_ASSERT(!value_t.empty(), JSON_TEXT("DoArray is empty"));
	JSON_ASSERT_SAFE(value_t[0] == JSON_TEXT('['), JSON_TEXT("DoArray is not an array"), parent -> Nullify(); return;);
	if (json_unlikely(value_t.length() <= 2)) return;  // just a [] (blank array)
	
	#ifdef JSON_SAFE
		json_string newValue;  //share this so it has a reserved buffer
	#endif
	size_t starting = 1;  //ignore the [
	
	//Not sure what's in the array, so we have to use commas
	for(size_t ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, 1);
		ending != json_string::npos;
		ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, starting)){
		
		#ifdef JSON_SAFE
			newValue.assign(value_t.begin() + starting, value_t.begin() + ending);
			JSON_ASSERT_SAFE(FIND_NEXT_RELEVANT(JSON_TEXT(':'), newValue, 0) == json_string::npos, JSON_TEXT("Key/Value pairs are not allowed in arrays"), parent -> Nullify(); return;);
			NewNode(parent, json_global(EMPTY_JSON_STRING), newValue, true);
		#else
			NewNode(parent, json_global(EMPTY_JSON_STRING), json_string(value_t.begin() + starting, value_t.begin() + ending), true);
		#endif
		starting = ending + 1;
	}
	//since the last one will not find the comma, we have to add it here, but ignore the final ]
	
	#ifdef JSON_SAFE
		newValue.assign(value_t.begin() + starting, value_t.end() - 1);
		JSON_ASSERT_SAFE(FIND_NEXT_RELEVANT(JSON_TEXT(':'), newValue, 0) == json_string::npos, JSON_TEXT("Key/Value pairs are not allowed in arrays"), parent -> Nullify(); return;);
		NewNode(parent, json_global(EMPTY_JSON_STRING), newValue, true);
	#else
		NewNode(parent, json_global(EMPTY_JSON_STRING), json_string(value_t.begin() + starting, value_t.end() - 1), true);
	#endif
}